

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::HelpersReadFilesLDPC::helper_parse_sep_ints<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *in,
          char delimiter)

{
  iterator iVar1;
  pointer puVar2;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  ulong uVar8;
  void *pvVar9;
  int *piVar10;
  longlong lVar11;
  undefined8 uVar12;
  pointer pcVar13;
  ulong uVar14;
  uint local_60;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(in," \t\n\r\f\v",0xffffffffffffffff,6);
  uVar8 = sVar7 + 1;
  if (in->_M_string_length < uVar8) {
LAB_0012e00a:
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar8)
    ;
  }
  in->_M_string_length = uVar8;
  (in->_M_dataplus)._M_p[uVar8] = '\0';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(in," \t\n\r\f\v",0,6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase(in,0,sVar7)
  ;
  uVar8 = in->_M_string_length;
  if (uVar8 == 0) {
    sVar7 = 0;
  }
  else {
    local_5c = (int)delimiter;
    pcVar13 = (in->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      pvVar9 = memchr(pcVar13 + sVar7,local_5c,uVar8 - sVar7);
      if ((pvVar9 == (void *)0x0) ||
         (uVar14 = (long)pvVar9 - (long)pcVar13, uVar14 == 0xffffffffffffffff)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,in,sVar7,uVar14 - sVar7);
      _Var4._M_p = local_58._M_dataplus._M_p;
      piVar10 = __errno_location();
      iVar5 = *piVar10;
      *piVar10 = 0;
      lVar11 = strtoll(_Var4._M_p,&local_38,10);
      if (local_38 == _Var4._M_p) {
        std::__throw_invalid_argument("stoll");
LAB_0012dffe:
        uVar8 = std::__throw_out_of_range("stoll");
        goto LAB_0012e00a;
      }
      if (*piVar10 == 0) {
        *piVar10 = iVar5;
      }
      else if (*piVar10 == 0x22) goto LAB_0012dffe;
      local_60 = (uint)lVar11;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (__return_storage_ptr__,iVar1,&local_60);
      }
      else {
        *iVar1._M_current = local_60;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = (in->_M_dataplus)._M_p;
      do {
        lVar3 = uVar14 + 1;
        uVar14 = uVar14 + 1;
        iVar5 = isspace((int)pcVar13[lVar3]);
      } while (iVar5 != 0);
      uVar8 = in->_M_string_length;
      sVar7 = uVar14;
    } while (uVar14 < uVar8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,in,sVar7,0xffffffffffffffff);
  _Var4._M_p = local_58._M_dataplus._M_p;
  piVar10 = __errno_location();
  iVar5 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtoll(_Var4._M_p,&local_38,10);
  uVar6 = (uint)lVar11;
  if (local_38 == _Var4._M_p) {
    uVar12 = std::__throw_invalid_argument("stoll");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(__return_storage_ptr__->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    _Unwind_Resume(uVar12);
  }
  if (*piVar10 != 0) {
    if (*piVar10 != 0x22) goto LAB_0012df9e;
    uVar6 = std::__throw_out_of_range("stoll");
  }
  *piVar10 = iVar5;
LAB_0012df9e:
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_60 = uVar6;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (__return_storage_ptr__,iVar1,&local_60);
  }
  else {
    *iVar1._M_current = uVar6;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<idx_t> helper_parse_sep_ints(std::string &in, const char delimiter) {
            std::vector <idx_t> ret;

            std::size_t start = 0;
            std::size_t end = 0;
            constexpr auto trimmed_whitespace = " \t\n\r\f\v";

            // trim leading and trailing whitespace
            in.erase(in.find_last_not_of(trimmed_whitespace) + 1);
            in.erase(0, in.find_first_not_of(trimmed_whitespace));

            while (std::string::npos != (end = in.find(delimiter, start))) {
                ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start, end - start))));
                start = end + 1;
                while (::isspace(in[start]))
                    ++start;
            }
            ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start))));
            return ret;
        }